

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall
c4::yml::Parser::_apply_chomp(Parser *this,substr buf,size_t *pos,BlockChomp_e chomp)

{
  ulong uVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  undefined1 uVar5;
  ulong uVar6;
  csubstr fmt;
  basic_substring<char> bVar7;
  basic_substring<char> local_40;
  
  uVar1 = *pos;
  if (uVar1 != 0xffffffffffffffff && buf.len < uVar1) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      uVar5 = (*pcVar3)();
      return (bool)uVar5;
    }
    handle_error(0x1fce74,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x154e,"num <= len || num == npos");
  }
  uVar6 = buf.len;
  if (uVar1 != 0xffffffffffffffff) {
    uVar6 = uVar1;
  }
  basic_substring<char>::basic_substring(&local_40,buf.str,uVar6);
  bVar7 = basic_substring<char>::trimr(&local_40,'\n');
  uVar6 = bVar7.len;
  if (chomp == CHOMP_CLIP) {
    if (uVar6 == uVar1) {
      pcVar2 = (this->m_filter_arena).str;
      *pos = uVar1 + 1;
      pcVar2[uVar1] = '\n';
      return true;
    }
    uVar6 = uVar6 + 1;
  }
  else if (chomp != CHOMP_STRIP) {
    if (chomp == CHOMP_KEEP) {
      return uVar6 == uVar1;
    }
    bVar4 = is_debugger_attached();
    if ((bVar4) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      uVar5 = (*pcVar3)();
      return (bool)uVar5;
    }
    fmt.len = 0x1a;
    fmt.str = "ERROR: unknown chomp style";
    _err<>(this,fmt);
    return false;
  }
  *pos = uVar6;
  return false;
}

Assistant:

bool Parser::_apply_chomp(substr buf, size_t *C4_RESTRICT pos, BlockChomp_e chomp)
{
    substr trimmed = buf.first(*pos).trimr('\n');
    bool added_newline = false;
    switch(chomp)
    {
    case CHOMP_KEEP:
        if(trimmed.len == *pos)
        {
            _c4dbgpf("chomp=KEEP: add missing newline @{}", *pos);
            //m_filter_arena.str[(*pos)++] = '\n';
            added_newline = true;
        }
        break;
    case CHOMP_CLIP:
        if(trimmed.len == *pos)
        {
            _c4dbgpf("chomp=CLIP: add missing newline @{}", *pos);
            m_filter_arena.str[(*pos)++] = '\n';
            added_newline = true;
        }
        else
        {
            _c4dbgpf("chomp=CLIP: include single trailing newline @{}", trimmed.len+1);
            *pos = trimmed.len + 1;
        }
        break;
    case CHOMP_STRIP:
        _c4dbgpf("chomp=STRIP: strip {}-{}-{} newlines", *pos, trimmed.len, *pos-trimmed.len);
        *pos = trimmed.len;
        break;
    default:
        _c4err("unknown chomp style");
    }
    return added_newline;
}